

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_base64_encode(uint8_t *data,size_t data_len,char *ptls_base64_text)

{
  long lVar1;
  long in_RDX;
  int iVar2;
  long in_RSI;
  long in_RDI;
  int lt;
  int l;
  int local_20;
  int local_1c;
  
  local_20 = 0;
  for (local_1c = 0; 2 < (ulong)(in_RSI - local_1c); local_1c = local_1c + 3) {
    ptls_base64_cell((uint8_t *)(in_RDI + local_1c),(char *)(in_RDX + local_20));
    local_20 = local_20 + 4;
  }
  lVar1 = in_RSI - local_1c;
  if (in_RSI != local_1c) {
    if (lVar1 == 1) {
      *(char *)(in_RDX + local_20) =
           ptls_base64_alphabet[(int)(uint)*(byte *)(in_RDI + local_1c) >> 2];
      *(char *)(in_RDX + (local_20 + 1)) =
           ptls_base64_alphabet[(int)((*(byte *)(in_RDI + local_1c) & 3) << 4)];
      iVar2 = local_20 + 3;
      *(undefined1 *)(in_RDX + (local_20 + 2)) = 0x3d;
      local_20 = local_20 + 4;
      *(undefined1 *)(in_RDX + iVar2) = 0x3d;
    }
    else if (lVar1 == 2) {
      *(char *)(in_RDX + local_20) =
           ptls_base64_alphabet[(int)(uint)*(byte *)(in_RDI + local_1c) >> 2];
      *(char *)(in_RDX + (local_20 + 1)) =
           ptls_base64_alphabet
           [(int)((*(byte *)(in_RDI + local_1c) & 3) << 4 |
                 (int)(uint)*(byte *)(in_RDI + (local_1c + 1)) >> 4)];
      iVar2 = local_20 + 3;
      *(char *)(in_RDX + (local_20 + 2)) =
           ptls_base64_alphabet[(int)((*(byte *)(in_RDI + (local_1c + 1)) & 0xf) << 2)];
      local_20 = local_20 + 4;
      *(undefined1 *)(in_RDX + iVar2) = 0x3d;
    }
  }
  *(undefined1 *)(in_RDX + local_20) = 0;
  return local_20 + 1;
}

Assistant:

int ptls_base64_encode(const uint8_t *data, size_t data_len, char *ptls_base64_text)
{
    int l = 0;
    int lt = 0;

    while ((data_len - l) >= 3) {
        ptls_base64_cell(data + l, ptls_base64_text + lt);
        l += 3;
        lt += 4;
    }

    switch (data_len - l) {
    case 0:
        break;
    case 1:
        ptls_base64_text[lt++] = ptls_base64_alphabet[data[l] >> 2];
        ptls_base64_text[lt++] = ptls_base64_alphabet[(data[l] & 3) << 4];
        ptls_base64_text[lt++] = '=';
        ptls_base64_text[lt++] = '=';
        break;
    case 2:
        ptls_base64_text[lt++] = ptls_base64_alphabet[data[l] >> 2];
        ptls_base64_text[lt++] = ptls_base64_alphabet[((data[l] & 3) << 4) | (data[l + 1] >> 4)];
        ptls_base64_text[lt++] = ptls_base64_alphabet[((data[l + 1] & 15) << 2)];
        ptls_base64_text[lt++] = '=';
        break;
    default:
        break;
    }
    ptls_base64_text[lt++] = 0;

    return lt;
}